

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_1D_mri.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  FILE *pFVar8;
  FILE *__stream;
  FILE *__stream_00;
  undefined8 *puVar9;
  long lVar10;
  char *pcVar11;
  double *pdVar12;
  UserData udata;
  long lVar13;
  double dVar14;
  void *inner_arkode_mem;
  void *arkode_mem;
  SUNContext ctx;
  MRIStepInnerStepper inner_stepper;
  sunrealtype t;
  long ncfn;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nffi;
  long nfse;
  long netf;
  long nstf_a;
  long nstf;
  long nsts;
  long nffe;
  long nfsi;
  long local_120;
  long local_118;
  undefined8 local_110;
  long local_108;
  double local_100;
  undefined1 local_f8 [16];
  long local_e8;
  long local_e0;
  long local_d8;
  double local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  long local_b8;
  long local_b0;
  long *local_a8;
  double local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  local_118 = 0;
  local_120 = 0;
  local_c8 = 0;
  uVar4 = SUNContext_Create(0,&local_110);
  if ((int)uVar4 < 0) {
    pcVar11 = "SUNContext_Create";
    goto LAB_0010325d;
  }
  plVar5 = (long *)malloc(0x30);
  if (plVar5 == (long *)0x0) {
    main_cold_13();
    return 1;
  }
  *plVar5 = 200;
  plVar5[3] = 0x400c000000000000;
  plVar5[4] = 0x3fd0000000000000;
  plVar5[5] = 0x3eb0c6f7a0b5ed8d;
  plVar5[1] = 0x3f747ae147ae147b;
  plVar5[2] = 0x3ff0000000000000;
  puts("\n1D Advection-Reaction example problem:");
  printf("    N = %li,  NEQ = %li\n",*plVar5,600);
  printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",(int)plVar5[2],(int)plVar5[3]);
  printf("    advection coefficient:  c = %g\n",(int)plVar5[4]);
  printf("    reltol = %.1e,  abstol = %.1e\n\n",0xa0b5ed8d,0xd9d7bdbb);
  local_108 = N_VNew_Serial(600,local_110);
  if (local_108 == 0) {
    main_cold_12();
    return 1;
  }
  lVar13 = *plVar5;
  local_f8._8_8_ = 0;
  local_f8._0_8_ = plVar5[2];
  local_100 = (double)plVar5[3];
  local_d0 = (double)plVar5[1];
  lVar6 = N_VGetArrayPointer(local_108);
  if (0 < lVar13) {
    local_f8._8_4_ = SUB84(local_100 / (double)local_f8._0_8_,0);
    local_f8._12_4_ = (int)((ulong)(local_100 / (double)local_f8._0_8_) >> 0x20);
    pdVar12 = (double *)(lVar6 + 0x10);
    lVar6 = 0;
    do {
      dVar14 = (double)lVar6 * local_d0 + -0.5;
      dVar14 = exp((-dVar14 * dVar14) / 0.1);
      dVar14 = dVar14 * 0.1;
      auVar1._8_4_ = SUB84(dVar14 + (double)local_f8._8_8_,0);
      auVar1._0_8_ = dVar14 + (double)local_f8._0_8_;
      auVar1._12_4_ = (int)((ulong)(dVar14 + (double)local_f8._8_8_) >> 0x20);
      *(undefined1 (*) [16])(pdVar12 + -2) = auVar1;
      *pdVar12 = local_100 + dVar14;
      lVar6 = lVar6 + 1;
      pdVar12 = pdVar12 + 3;
    } while (lVar13 != lVar6);
  }
  lVar13 = local_108;
  local_d8 = N_VClone(local_108);
  if (local_d8 == 0) {
    main_cold_11();
    return 1;
  }
  local_e0 = N_VClone(lVar13);
  if (local_e0 == 0) {
    main_cold_10();
    return 1;
  }
  local_e8 = N_VClone(lVar13);
  lVar6 = local_d8;
  if (local_e8 == 0) {
    main_cold_9();
    return 1;
  }
  N_VConst(0,local_d8);
  lVar7 = N_VGetArrayPointer(lVar6);
  lVar6 = local_e0;
  if (lVar7 == 0) {
    main_cold_8();
    return 1;
  }
  lVar10 = 0;
  do {
    *(undefined8 *)(lVar7 + lVar10) = 0x3ff0000000000000;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x12c0);
  N_VConst(0,local_e0);
  lVar7 = N_VGetArrayPointer(lVar6);
  lVar6 = local_e8;
  if (lVar7 == 0) {
    main_cold_7();
    return 1;
  }
  lVar10 = 8;
  do {
    *(undefined8 *)(lVar7 + lVar10) = 0x3ff0000000000000;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x12c8);
  N_VConst(0,local_e8);
  lVar6 = N_VGetArrayPointer(lVar6);
  if (lVar6 == 0) {
    main_cold_6();
    return 1;
  }
  lVar7 = 0x10;
  do {
    *(undefined8 *)(lVar6 + lVar7) = 0x3ff0000000000000;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x12d0);
  lVar6 = SUNBandMatrix(600,4,4,local_110);
  if (lVar6 == 0) {
    main_cold_5();
    return 1;
  }
  lVar7 = SUNLinSol_Band(lVar13,lVar6,local_110);
  if (lVar7 == 0) {
    main_cold_4();
    return 1;
  }
  local_120 = ARKStepCreate(0,0,ff,lVar13,local_110);
  if (local_120 == 0) {
    main_cold_3();
    return 1;
  }
  uVar4 = ARKodeSetUserData(local_120,plVar5);
  if (-1 < (int)uVar4) {
    uVar4 = ARKStepSetTableNum(local_120,0x68,0xffffffff);
    if ((int)uVar4 < 0) {
      pcVar11 = "ARKStepSetTableNum";
      goto LAB_0010325d;
    }
    uVar4 = ARKodeSStolerances(0xa0b5ed8d,local_120);
    if ((int)uVar4 < 0) {
      pcVar11 = "ARKodeSStolerances";
      goto LAB_0010325d;
    }
    uVar4 = ARKodeSetLinearSolver(local_120,lVar7,lVar6);
    if ((int)uVar4 < 0) {
      pcVar11 = "ARKodeSetLinearSolver";
      goto LAB_0010325d;
    }
    uVar4 = ARKodeSetJacFn(local_120,Jf);
    if ((int)uVar4 < 0) {
      pcVar11 = "ARKodeSetJacFn";
      goto LAB_0010325d;
    }
    uVar4 = ARKStepCreateMRIStepInnerStepper(local_120,&local_c8);
    if ((int)uVar4 < 0) {
      pcVar11 = "ARKStepCreateMRIStepInnerStepper";
      goto LAB_0010325d;
    }
    local_118 = MRIStepCreate(0,fs,0,lVar13,local_c8,local_110);
    if (local_118 == 0) {
      main_cold_2();
      return 1;
    }
    uVar4 = ARKodeSetUserData(local_118,plVar5);
    if (-1 < (int)uVar4) {
      uVar4 = ARKodeSetFixedStep(0x47ae147b,local_118);
      if (-1 < (int)uVar4) {
        local_b8 = lVar7;
        local_b0 = lVar6;
        pFVar8 = fopen("mesh.txt","w");
        lVar13 = 0;
        do {
          fprintf(pFVar8,"  %.16e\n",SUB84((double)lVar13 * (double)plVar5[1],0));
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0xc9);
        local_a8 = plVar5;
        fclose(pFVar8);
        pFVar8 = fopen("u.txt","w");
        __stream = fopen("v.txt","w");
        __stream_00 = fopen("w.txt","w");
        puVar9 = (undefined8 *)N_VGetArrayPointer(local_108);
        if (puVar9 == (undefined8 *)0x0) {
          main_cold_1();
          return 1;
        }
        lVar13 = 0;
        do {
          fprintf(pFVar8," %.16e",(int)*(undefined8 *)((long)puVar9 + lVar13));
          lVar13 = lVar13 + 0x18;
        } while (lVar13 != 0x12c0);
        fprintf(pFVar8," %.16e",(int)*puVar9);
        fputc(10,pFVar8);
        lVar13 = 8;
        do {
          fprintf(__stream," %.16e",(int)*(undefined8 *)((long)puVar9 + lVar13));
          lVar13 = lVar13 + 0x18;
        } while (lVar13 != 0x12c8);
        fprintf(__stream," %.16e",(int)puVar9[1]);
        fputc(10,__stream);
        lVar13 = 0x10;
        do {
          fprintf(__stream_00," %.16e",(int)*(undefined8 *)((long)puVar9 + lVar13));
          lVar13 = lVar13 + 0x18;
        } while (lVar13 != 0x12d0);
        fprintf(__stream_00," %.16e",(int)puVar9[2]);
        fputc(10,__stream_00);
        local_c0 = 0;
        puts("        t      ||u||_rms   ||v||_rms   ||w||_rms");
        puts("   ----------------------------------------------");
        dVar14 = 0.1;
        uVar4 = 0;
        do {
          lVar13 = local_108;
          local_100 = (double)(ulong)uVar4;
          local_d0 = dVar14;
          uVar4 = ARKodeEvolve(local_118,local_108,&local_c0,1);
          if ((int)uVar4 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeEvolve",
                    (ulong)uVar4);
            break;
          }
          dVar14 = (double)N_VWL2Norm(lVar13,local_d8);
          dVar14 = (dVar14 * dVar14) / 200.0;
          dVar2 = 0.0;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_f8._8_8_;
          local_f8 = auVar3 << 0x40;
          if (0.0 < dVar14) {
            if (dVar14 < 0.0) {
              dVar2 = sqrt(dVar14);
            }
            else {
              dVar2 = SQRT(dVar14);
            }
          }
          local_a0 = dVar2;
          dVar14 = (double)N_VWL2Norm(lVar13,local_e0);
          dVar14 = (dVar14 * dVar14) / 200.0;
          if (0.0 < dVar14) {
            if (dVar14 < 0.0) {
              dVar14 = sqrt(dVar14);
            }
            else {
              dVar14 = SQRT(dVar14);
            }
            local_f8._0_8_ = dVar14;
          }
          dVar14 = (double)N_VWL2Norm(lVar13,local_e8);
          dVar14 = (dVar14 * dVar14) / 200.0;
          if ((0.0 < dVar14) && (dVar14 < 0.0)) {
            sqrt(dVar14);
          }
          printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",(int)local_c0,SUB84(local_a0,0));
          lVar13 = 0;
          do {
            fprintf(pFVar8," %.16e",(int)*(undefined8 *)((long)puVar9 + lVar13));
            lVar13 = lVar13 + 0x18;
          } while (lVar13 != 0x12c0);
          fprintf(pFVar8," %.16e",(int)*puVar9);
          fputc(10,pFVar8);
          lVar13 = 8;
          do {
            fprintf(__stream," %.16e",(int)*(undefined8 *)((long)puVar9 + lVar13));
            lVar13 = lVar13 + 0x18;
          } while (lVar13 != 0x12c8);
          fprintf(__stream," %.16e",(int)puVar9[1]);
          fputc(10,__stream);
          lVar13 = 0x10;
          do {
            fprintf(__stream_00," %.16e",(int)*(undefined8 *)((long)puVar9 + lVar13));
            lVar13 = lVar13 + 0x18;
          } while (lVar13 != 0x12d0);
          fprintf(__stream_00," %.16e",(int)puVar9[2]);
          fputc(10,__stream_00);
          dVar14 = 10.0;
          if (local_d0 + 0.1 <= 10.0) {
            dVar14 = local_d0 + 0.1;
          }
          uVar4 = SUB84(local_100,0) + 1;
        } while (uVar4 != 100);
        puts("   ----------------------------------------------");
        fclose(pFVar8);
        fclose(__stream);
        fclose(__stream_00);
        uVar4 = ARKodeGetNumSteps(local_118,&local_48);
        if ((int)uVar4 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeGetNumSteps",
                  (ulong)uVar4);
        }
        uVar4 = MRIStepGetNumRhsEvals(local_118,&local_68,local_38);
        plVar5 = local_a8;
        lVar13 = local_b8;
        if ((int)uVar4 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","MRIStepGetNumRhsEvals"
                  ,(ulong)uVar4);
        }
        uVar4 = ARKodeGetNumSteps(local_120,&local_50);
        if ((int)uVar4 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeGetNumSteps",
                  (ulong)uVar4);
        }
        uVar4 = ARKodeGetNumStepAttempts(local_120,&local_58);
        if ((int)uVar4 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                  "ARKodeGetNumStepAttempts",(ulong)uVar4);
        }
        uVar4 = ARKStepGetNumRhsEvals(local_120,local_40,&local_70);
        if ((int)uVar4 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKStepGetNumRhsEvals"
                  ,(ulong)uVar4);
        }
        uVar4 = ARKodeGetNumLinSolvSetups(local_120,&local_78);
        if ((int)uVar4 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                  "ARKodeGetNumLinSolvSetups",(ulong)uVar4);
        }
        uVar4 = ARKodeGetNumErrTestFails(local_120,&local_60);
        if ((int)uVar4 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                  "ARKodeGetNumErrTestFails",(ulong)uVar4);
        }
        uVar4 = ARKodeGetNumNonlinSolvIters(local_120,&local_90);
        if ((int)uVar4 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                  "ARKodeGetNumNonlinSolvIters",(ulong)uVar4);
        }
        uVar4 = ARKodeGetNumNonlinSolvConvFails(local_120,&local_98);
        if ((int)uVar4 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                  "ARKodeGetNumNonlinSolvConvFails",(ulong)uVar4);
        }
        uVar4 = ARKodeGetNumJacEvals(local_120,&local_80);
        if ((int)uVar4 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeGetNumJacEvals",
                  (ulong)uVar4);
        }
        uVar4 = ARKodeGetNumLinRhsEvals(local_120,&local_88);
        if ((int)uVar4 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                  "ARKodeGetNumLinRhsEvals",(ulong)uVar4);
        }
        puts("\nFinal Solver Statistics:");
        printf("   Slow Steps: nsts = %li\n",local_48);
        printf("   Fast Steps: nstf = %li (attempted = %li)\n",local_50,local_58);
        printf("   Total RHS evals:  Fs = %li,  Ff = %li\n",local_68,local_70);
        printf("   Total number of fast error test failures = %li\n",local_60);
        printf("   Total linear solver setups = %li\n",local_78);
        printf("   Total RHS evals for setting up the linear system = %li\n",local_88);
        printf("   Total number of Jacobian evaluations = %li\n",local_80);
        printf("   Total number of Newton iterations = %li\n",local_90);
        printf("   Total number of nonlinear solver convergence failures = %li\n",local_98);
        free(plVar5);
        ARKodeFree(&local_120);
        MRIStepInnerStepper_Free(&local_c8);
        ARKodeFree(&local_118);
        SUNLinSolFree(lVar13);
        SUNMatDestroy(local_b0);
        N_VDestroy(local_108);
        N_VDestroy(local_d8);
        N_VDestroy(local_e0);
        N_VDestroy(local_e8);
        SUNContext_Free(&local_110);
        return 0;
      }
      pcVar11 = "ARKodeSetFixedStep";
      goto LAB_0010325d;
    }
  }
  pcVar11 = "ARKodeSetUserData";
LAB_0010325d:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar11,(ulong)uVar4);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);  /* initial time                    */
  sunrealtype Tf     = SUN_RCONST(10.0); /* final time                      */
  int Nt             = 100;              /* total number of output times    */
  int Nvar           = 3;                /* number of solution fields       */
  sunindextype N     = 200;              /* spatial mesh size (N intervals) */
  sunrealtype a      = SUN_RCONST(1.0);  /* problem parameters              */
  sunrealtype b      = SUN_RCONST(3.5);
  sunrealtype c      = SUN_RCONST(0.25);
  sunrealtype ep     = SUN_RCONST(1.0e-6); /* stiffness parameter */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances          */
  sunrealtype abstol = SUN_RCONST(1.0e-10);

  /* general problem variables */
  sunrealtype hs;                           /* slow step size                 */
  int retval;                               /* reusable return flag           */
  N_Vector y                        = NULL; /* empty solution vector          */
  N_Vector umask                    = NULL; /* empty mask vectors             */
  N_Vector vmask                    = NULL;
  N_Vector wmask                    = NULL;
  SUNMatrix A                       = NULL; /* empty matrix for linear solver */
  SUNLinearSolver LS                = NULL; /* empty linear solver structure  */
  void* arkode_mem                  = NULL; /* empty ARKode memory structure  */
  void* inner_arkode_mem            = NULL; /* empty ARKode memory structure  */
  MRIStepInnerStepper inner_stepper = NULL; /* inner stepper                  */
  sunrealtype t, dTout, tout;               /* current/output time data       */
  sunrealtype u, v, w;                      /* temp data values               */
  FILE *FID, *UFID, *VFID, *WFID;           /* output file pointers           */
  int iout;                                 /* output counter                 */
  long int nsts, nstf, nstf_a, netf;        /* step stats                     */
  long int nfse, nfsi, nffe, nffi;          /* RHS stats                      */
  long int nsetups, nje, nfeLS;             /* linear solver stats            */
  long int nni, ncfn;                       /* nonlinear solver stats         */
  sunindextype NEQ;                         /* number of equations            */
  sunindextype i;                           /* counter                        */
  UserData udata    = NULL;                 /* user data pointer              */
  sunrealtype* data = NULL;                 /* array for vector data          */

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* allocate udata structure */
  udata = (UserData)malloc(sizeof(*udata));
  if (check_retval((void*)udata, "malloc", 2)) { return 1; }

  /* store the inputs in the UserData structure */
  udata->N  = N;
  udata->a  = a;
  udata->b  = b;
  udata->c  = c;
  udata->ep = ep;
  udata->dx = SUN_RCONST(1.0) / N; /* periodic BC, divide by N not N-1 */

  /* set total allocated vector length */
  NEQ = Nvar * udata->N;

  /* set the slow step size */
  hs = SUN_RCONST(0.5) * (udata->dx / SUNRabs(c));

  /* Initial problem output */
  printf("\n1D Advection-Reaction example problem:\n");
  printf("    N = %li,  NEQ = %li\n", (long int)udata->N, (long int)NEQ);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         udata->a, udata->b, udata->ep);
  printf("    advection coefficient:  c = %" GSYM "\n", udata->c);
  printf("    reltol = %.1" ESYM ",  abstol = %.1" ESYM "\n\n", reltol, abstol);

  /* Create solution vector */
  y = N_VNew_Serial(NEQ, ctx); /* Create vector for solution */
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }

  /* Set initial condition */
  retval = SetIC(y, udata);
  if (check_retval(&retval, "SetIC", 1)) { return 1; }

  /* Create vector masks */
  umask = N_VClone(y);
  if (check_retval((void*)umask, "N_VClone", 0)) { return 1; }

  vmask = N_VClone(y);
  if (check_retval((void*)vmask, "N_VClone", 0)) { return 1; }

  wmask = N_VClone(y);
  if (check_retval((void*)wmask, "N_VClone", 0)) { return 1; }

  /* Set mask array values for each solution component */
  N_VConst(0.0, umask);
  data = N_VGetArrayPointer(umask);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }
  for (i = 0; i < N; i++) { data[IDX(i, 0)] = SUN_RCONST(1.0); }

  N_VConst(0.0, vmask);
  data = N_VGetArrayPointer(vmask);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }
  for (i = 0; i < N; i++) { data[IDX(i, 1)] = SUN_RCONST(1.0); }

  N_VConst(0.0, wmask);
  data = N_VGetArrayPointer(wmask);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }
  for (i = 0; i < N; i++) { data[IDX(i, 2)] = SUN_RCONST(1.0); }

  /*
   * Create the fast integrator and set options
   */

  /* Initialize matrix and linear solver data structures */
  A = SUNBandMatrix(NEQ, 4, 4, ctx);
  if (check_retval((void*)A, "SUNBandMatrix", 0)) { return 1; }

  LS = SUNLinSol_Band(y, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return 1; }

  /* Initialize the fast integrator. Specify the implicit fast right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, and the
     initial dependent variable vector y. */
  inner_arkode_mem = ARKStepCreate(NULL, ff, T0, y, ctx);
  if (check_retval((void*)inner_arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Attach user data to fast integrator */
  retval = ARKodeSetUserData(inner_arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the fast method */
  retval = ARKStepSetTableNum(inner_arkode_mem, ARKODE_ARK324L2SA_DIRK_4_2_3, -1);
  if (check_retval(&retval, "ARKStepSetTableNum", 1)) { return 1; }

  /* Specify fast tolerances */
  retval = ARKodeSStolerances(inner_arkode_mem, reltol, abstol);
  if (check_retval(&retval, "ARKodeSStolerances", 1)) { return 1; }

  /* Attach matrix and linear solver */
  retval = ARKodeSetLinearSolver(inner_arkode_mem, LS, A);
  if (check_retval(&retval, "ARKodeSetLinearSolver", 1)) { return 1; }

  /* Set the Jacobian routine */
  retval = ARKodeSetJacFn(inner_arkode_mem, Jf);
  if (check_retval(&retval, "ARKodeSetJacFn", 1)) { return 1; }

  /* Create inner stepper */
  retval = ARKStepCreateMRIStepInnerStepper(inner_arkode_mem, &inner_stepper);
  if (check_retval(&retval, "ARKStepCreateMRIStepInnerStepper", 1))
  {
    return 1;
  }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the slow integrator. Specify the explicit slow right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, the
     initial dependent variable vector y, and the fast integrator. */
  arkode_mem = MRIStepCreate(fs, NULL, T0, y, inner_stepper, ctx);
  if (check_retval((void*)arkode_mem, "MRIStepCreate", 0)) { return 1; }

  /* Pass udata to user functions */
  retval = ARKodeSetUserData(arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the slow step size */
  retval = ARKodeSetFixedStep(arkode_mem, hs);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* output spatial mesh to disk (add extra point for periodic BC) */
  FID = fopen("mesh.txt", "w");
  for (i = 0; i < N + 1; i++)
  {
    fprintf(FID, "  %.16" ESYM "\n", udata->dx * i);
  }
  fclose(FID);

  /* Open output stream for results, access data arrays */
  UFID = fopen("u.txt", "w");
  VFID = fopen("v.txt", "w");
  WFID = fopen("w.txt", "w");

  /* output initial condition to disk (extra output for periodic BC) */
  data = N_VGetArrayPointer(y);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }

  for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM, data[IDX(i, 0)]); }
  fprintf(UFID, " %.16" ESYM, data[IDX(0, 0)]);
  fprintf(UFID, "\n");

  for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM, data[IDX(i, 1)]); }
  fprintf(VFID, " %.16" ESYM, data[IDX(0, 1)]);
  fprintf(VFID, "\n");

  for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM, data[IDX(i, 2)]); }
  fprintf(WFID, " %.16" ESYM, data[IDX(0, 2)]);
  fprintf(WFID, "\n");

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration,
     then prints results.  Stops when the final time has been reached */
  t     = T0;
  dTout = (Tf - T0) / Nt;
  tout  = T0 + dTout;
  printf("        t      ||u||_rms   ||v||_rms   ||w||_rms\n");
  printf("   ----------------------------------------------\n");
  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }

    /* access/print solution statistics */
    u = N_VWL2Norm(y, umask);
    u = SUNRsqrt(u * u / N);
    v = N_VWL2Norm(y, vmask);
    v = SUNRsqrt(v * v / N);
    w = N_VWL2Norm(y, wmask);
    w = SUNRsqrt(w * w / N);
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           u, v, w);

    /* output results to disk (extr output for periodic BC) */
    for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM, data[IDX(i, 0)]); }
    fprintf(UFID, " %.16" ESYM, data[IDX(0, 0)]);
    fprintf(UFID, "\n");

    for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM, data[IDX(i, 1)]); }
    fprintf(VFID, " %.16" ESYM, data[IDX(0, 1)]);
    fprintf(VFID, "\n");

    for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM, data[IDX(i, 2)]); }
    fprintf(WFID, " %.16" ESYM, data[IDX(0, 2)]);
    fprintf(WFID, "\n");

    /* successful solve: update output time */
    tout += dTout;
    tout = (tout > Tf) ? Tf : tout;
  }
  printf("   ----------------------------------------------\n");
  fclose(UFID);
  fclose(VFID);
  fclose(WFID);

  /* Get some slow integrator statistics */
  retval = ARKodeGetNumSteps(arkode_mem, &nsts);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = MRIStepGetNumRhsEvals(arkode_mem, &nfse, &nfsi);
  check_retval(&retval, "MRIStepGetNumRhsEvals", 1);

  /* Get some fast integrator statistics */
  retval = ARKodeGetNumSteps(inner_arkode_mem, &nstf);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumStepAttempts(inner_arkode_mem, &nstf_a);
  check_retval(&retval, "ARKodeGetNumStepAttempts", 1);
  retval = ARKStepGetNumRhsEvals(inner_arkode_mem, &nffe, &nffi);
  check_retval(&retval, "ARKStepGetNumRhsEvals", 1);
  retval = ARKodeGetNumLinSolvSetups(inner_arkode_mem, &nsetups);
  check_retval(&retval, "ARKodeGetNumLinSolvSetups", 1);
  retval = ARKodeGetNumErrTestFails(inner_arkode_mem, &netf);
  check_retval(&retval, "ARKodeGetNumErrTestFails", 1);
  retval = ARKodeGetNumNonlinSolvIters(inner_arkode_mem, &nni);
  check_retval(&retval, "ARKodeGetNumNonlinSolvIters", 1);
  retval = ARKodeGetNumNonlinSolvConvFails(inner_arkode_mem, &ncfn);
  check_retval(&retval, "ARKodeGetNumNonlinSolvConvFails", 1);
  retval = ARKodeGetNumJacEvals(inner_arkode_mem, &nje);
  check_retval(&retval, "ARKodeGetNumJacEvals", 1);
  retval = ARKodeGetNumLinRhsEvals(inner_arkode_mem, &nfeLS);
  check_retval(&retval, "ARKodeGetNumLinRhsEvals", 1);

  /* Print some final statistics */
  printf("\nFinal Solver Statistics:\n");
  printf("   Slow Steps: nsts = %li\n", nsts);
  printf("   Fast Steps: nstf = %li (attempted = %li)\n", nstf, nstf_a);
  printf("   Total RHS evals:  Fs = %li,  Ff = %li\n", nfse, nffi);
  printf("   Total number of fast error test failures = %li\n", netf);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n",
         ncfn);

  /* Clean up and return with successful completion */
  free(udata);                              /* Free user data         */
  ARKodeFree(&inner_arkode_mem);            /* Free integrator memory */
  MRIStepInnerStepper_Free(&inner_stepper); /* Free inner stepper */
  ARKodeFree(&arkode_mem);                  /* Free integrator memory */
  SUNLinSolFree(LS);                        /* Free linear solver     */
  SUNMatDestroy(A);                         /* Free matrix            */
  N_VDestroy(y);                            /* Free vectors           */
  N_VDestroy(umask);
  N_VDestroy(vmask);
  N_VDestroy(wmask);
  SUNContext_Free(&ctx); /* Free context */

  return 0;
}